

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  ImGuiWindow *this;
  ImVec2 IVar2;
  ImDrawList *draw_list;
  bool bVar3;
  ImGuiContext *pIVar4;
  ImU32 tab_id;
  int iVar5;
  ImU32 col;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  float _x;
  ImVec2 IVar10;
  ImGuiID local_174;
  ImGuiCol local_170;
  ImGuiCol local_16c;
  bool local_151;
  bool just_closed;
  ImGuiID close_button_id;
  bool hovered_unblocked;
  ImU32 tab_col;
  ImDrawList *display_draw_list;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 IStack_108;
  ImGuiButtonFlags button_flags;
  ImVec2 local_100;
  ImVec2 backup_cursor_max_pos;
  ImVec2 local_ec;
  bool local_e1;
  ImVec2 IStack_e0;
  bool want_clip_rect;
  undefined1 local_d8 [8];
  ImRect bb;
  ImVec2 pos;
  ImVec2 backup_main_cursor_pos;
  undefined1 local_94 [4];
  bool tab_contents_visible;
  bool tab_appearing;
  bool tab_bar_focused;
  bool tab_bar_appearing;
  byte local_71;
  ImGuiTabItem *pIStack_70;
  bool tab_is_new;
  ImGuiTabItem *tab;
  float fStack_60;
  ImVec2 size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabItemFlags flags_local;
  bool *p_open_local;
  char *label_local;
  ImGuiTabBar *tab_bar_local;
  
  if ((tab_bar->WantLayout & 1U) != 0) {
    TabBarLayout(tab_bar);
  }
  pIVar4 = GImGui;
  this = GImGui->CurrentWindow;
  if ((this->SkipItems & 1U) == 0) {
    tab_id = TabBarCalcTabID(tab_bar,label);
    if ((p_open == (bool *)0x0) || ((*p_open & 1U) != 0)) {
      register0x00001200 = TabItemCalcSize(label,p_open != (bool *)0x0);
      pIStack_70 = TabBarFindTabByID(tab_bar,tab_id);
      local_71 = 0;
      bVar8 = pIStack_70 == (ImGuiTabItem *)0x0;
      if (bVar8) {
        ImGuiTabItem::ImGuiTabItem((ImGuiTabItem *)local_94);
        ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)local_94);
        pIStack_70 = ImVector<ImGuiTabItem>::back(&tab_bar->Tabs);
        pIStack_70->ID = tab_id;
        pIStack_70->Width = tab._4_4_;
      }
      local_71 = bVar8;
      iVar5 = ImVector<ImGuiTabItem>::index_from_ptr(&tab_bar->Tabs,pIStack_70);
      tab_bar->LastTabItemIdx = (short)iVar5;
      pIStack_70->WidthContents = tab._4_4_;
      g._4_4_ = flags;
      if (p_open == (bool *)0x0) {
        g._4_4_ = flags | 0x100000;
      }
      bVar8 = tab_bar->PrevFrameVisible + 1 < pIVar4->FrameCount;
      bVar9 = (tab_bar->Flags & 0x200000U) != 0;
      bVar3 = pIStack_70->LastFrameVisible + 1 < pIVar4->FrameCount;
      pIStack_70->LastFrameVisible = pIVar4->FrameCount;
      pIStack_70->Flags = g._4_4_;
      iVar5 = ImGuiTextBuffer::size(&tab_bar->TabsNames);
      pIStack_70->NameOffset = iVar5;
      sVar6 = strlen(label);
      ImGuiTextBuffer::append(&tab_bar->TabsNames,label,label + sVar6 + 1);
      if ((!bVar3) && ((tab_bar->Flags & 1U) == 0)) {
        pIStack_70->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab =
             pIStack_70->Width + (pIVar4->Style).ItemInnerSpacing.x + tab_bar->OffsetNextTab;
      }
      if ((((bVar3) && ((tab_bar->Flags & 2U) != 0)) && (tab_bar->NextSelectedTabId == 0)) &&
         ((!bVar8 || (tab_bar->SelectedTabId == 0)))) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      if (((g._4_4_ & 2) != 0) && (tab_bar->SelectedTabId != tab_id)) {
        tab_bar->NextSelectedTabId = tab_id;
      }
      tab_bar_local._7_1_ = tab_bar->VisibleTabId == tab_id;
      if (tab_bar_local._7_1_) {
        tab_bar->VisibleTabWasSubmitted = true;
      }
      else if ((((tab_bar->SelectedTabId == 0) && (bVar8)) && ((tab_bar->Tabs).Size == 1)) &&
              ((tab_bar->Flags & 2U) == 0)) {
        tab_bar_local._7_1_ = true;
      }
      if ((!bVar3) || ((bVar8 && ((local_71 & 1) == 0)))) {
        if (tab_bar->SelectedTabId == tab_id) {
          pIStack_70->LastFrameSelected = pIVar4->FrameCount;
        }
        IVar2 = (this->DC).CursorPos;
        stack0xffffffffffffff9c = (ImVec2)CONCAT44(fStack_60,pIStack_70->Width);
        ImVec2::ImVec2(&pos,(float)(int)pIStack_70->Offset - tab_bar->ScrollingAnim,0.0);
        IVar10 = ::operator+(&(tab_bar->BarRect).Min,&pos);
        (this->DC).CursorPos = IVar10;
        bb.Max = (this->DC).CursorPos;
        IStack_e0 = ::operator+(&bb.Max,(ImVec2 *)((long)&tab + 4));
        ImRect::ImRect((ImRect *)local_d8,&bb.Max,&stack0xffffffffffffff20);
        local_151 = true;
        if ((tab_bar->BarRect).Min.x <= (float)local_d8._0_4_) {
          local_151 = (tab_bar->BarRect).Max.x <= bb.Min.x;
        }
        local_e1 = local_151;
        if (local_151 != false) {
          _x = ImMax<float>((float)local_d8._0_4_,(tab_bar->BarRect).Min.x);
          ImVec2::ImVec2(&local_ec,_x,(float)local_d8._4_4_ - 1.0);
          ImVec2::ImVec2((ImVec2 *)&backup_cursor_max_pos.y,(tab_bar->BarRect).Max.x,bb.Min.y);
          PushClipRect(&local_ec,(ImVec2 *)&backup_cursor_max_pos.y,true);
        }
        local_100 = (this->DC).CursorMaxPos;
        IStack_108 = ImRect::GetSize((ImRect *)local_d8);
        ItemSize(&stack0xfffffffffffffef8,(pIVar4->Style).FramePadding.y);
        (this->DC).CursorMaxPos = local_100;
        bVar8 = ItemAdd((ImRect *)local_d8,tab_id,(ImRect *)0x0);
        if (bVar8) {
          display_draw_list._4_4_ = 0x44;
          if ((pIVar4->DragDropActive & 1U) != 0) {
            display_draw_list._4_4_ = 0x1044;
          }
          display_draw_list._1_1_ =
               ButtonBehavior((ImRect *)local_d8,tab_id,(bool *)((long)&display_draw_list + 3),
                              (bool *)((long)&display_draw_list + 2),display_draw_list._4_4_);
          if ((bool)display_draw_list._1_1_) {
            tab_bar->NextSelectedTabId = tab_id;
          }
          display_draw_list._3_1_ =
               (display_draw_list._3_1_ & 1) != 0 || pIVar4->HoveredId == tab_id;
          if ((display_draw_list._2_1_ & 1) == 0) {
            SetItemAllowOverlap();
          }
          if ((((display_draw_list._2_1_ & 1) != 0) && (!bVar3)) &&
             ((bVar8 = IsMouseDragging(0,-1.0), bVar8 &&
              (((pIVar4->DragDropActive & 1U) == 0 && ((tab_bar->Flags & 1U) != 0)))))) {
            pIVar1 = &(pIVar4->IO).MouseDelta;
            if ((0.0 < pIVar1->x || pIVar1->x == 0.0) ||
               ((float)local_d8._0_4_ <= (pIVar4->IO).MousePos.x)) {
              if (((0.0 < (pIVar4->IO).MouseDelta.x) && (bb.Min.x < (pIVar4->IO).MousePos.x)) &&
                 ((tab_bar->Flags & 1U) != 0)) {
                TabBarQueueChangeTabOrder(tab_bar,pIStack_70,1);
              }
            }
            else if ((tab_bar->Flags & 1U) != 0) {
              TabBarQueueChangeTabOrder(tab_bar,pIStack_70,-1);
            }
          }
          draw_list = this->DrawList;
          if (((display_draw_list._2_1_ & 1) == 0) && ((display_draw_list._3_1_ & 1) == 0)) {
            if (tab_bar_local._7_1_ == false) {
              local_170 = 0x24;
              if (bVar9) {
                local_170 = 0x21;
              }
            }
            else {
              local_170 = 0x25;
              if (bVar9) {
                local_170 = 0x23;
              }
            }
            local_16c = local_170;
          }
          else {
            local_16c = 0x22;
          }
          col = GetColorU32(local_16c,1.0);
          TabItemBackground(draw_list,(ImRect *)local_d8,g._4_4_,col);
          RenderNavHighlight((ImRect *)local_d8,tab_id,1);
          bVar8 = IsItemHovered(8);
          if ((bVar8) &&
             ((bVar8 = IsMouseClicked(1,false), bVar8 || (bVar8 = IsMouseReleased(1), bVar8)))) {
            tab_bar->NextSelectedTabId = tab_id;
          }
          if ((tab_bar->Flags & 8U) != 0) {
            g._4_4_ = g._4_4_ | 4;
          }
          if (p_open == (bool *)0x0) {
            local_174 = 0;
          }
          else {
            local_174 = ImGuiWindow::GetID(this,(void *)((ulong)tab_id + 1));
          }
          bVar8 = TabItemLabelAndCloseButton
                            (draw_list,(ImRect *)local_d8,g._4_4_,tab_bar->FramePadding,label,tab_id
                             ,local_174);
          if ((bVar8) && (p_open != (bool *)0x0)) {
            *p_open = false;
            TabBarCloseTab(tab_bar,pIStack_70);
          }
          if ((local_e1 & 1U) != 0) {
            PopClipRect();
          }
          (this->DC).CursorPos = IVar2;
          if ((((pIVar4->HoveredId == tab_id) && ((display_draw_list._2_1_ & 1) == 0)) &&
              (0.5 < pIVar4->HoveredIdNotActiveTimer)) &&
             ((bVar8 = IsItemHovered(0), bVar8 && ((tab_bar->Flags & 0x20U) == 0)))) {
            pcVar7 = FindRenderedTextEnd(label,(char *)0x0);
            SetTooltip("%.*s",(ulong)(uint)((int)pcVar7 - (int)label),label);
          }
        }
        else {
          if ((local_e1 & 1U) != 0) {
            PopClipRect();
          }
          (this->DC).CursorPos = IVar2;
        }
      }
      else {
        PushItemFlag(0x18,true);
        ImRect::ImRect((ImRect *)&backup_main_cursor_pos);
        ItemAdd((ImRect *)&backup_main_cursor_pos,tab_id,(ImRect *)0x0);
        PopItemFlag();
      }
    }
    else {
      PushItemFlag(0x18,true);
      ImRect::ImRect((ImRect *)&size);
      ItemAdd((ImRect *)&size,tab_id,(ImRect *)0x0);
      PopItemFlag();
      tab_bar_local._7_1_ = false;
    }
  }
  else {
    tab_bar_local._7_1_ = false;
  }
  return tab_bar_local._7_1_;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->WidthContents = size.x;

    if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2((float)(int)tab->Offset - tab_bar->ScrollingAnim, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x >= tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->WidthContents)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + (float)(int)ImLerp(bb.GetWidth(), tab->WidthContents, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}